

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

StringView __thiscall
Corrade::Containers::String::findOr(String *this,StringView substring,char *fail)

{
  char *begin;
  ulong substringSize;
  BasicStringView<const_char> BVar1;
  StringView SVar2;
  BasicStringView<const_char> local_30;
  
  BasicStringView<const_char>::BasicStringView<const_char,_0>(&local_30,this);
  substringSize = substring._sizePlusFlags & 0x3fffffffffffffff;
  begin = Implementation::stringFindString
                    (local_30._data,local_30._sizePlusFlags & 0x3fffffffffffffff,substring._data,
                     substringSize);
  if (begin == (char *)0x0) {
    BVar1._sizePlusFlags = 0;
    BVar1._data = fail;
  }
  else {
    BVar1 = BasicStringView<const_char>::slice(&local_30,begin,begin + substringSize);
  }
  SVar2._data = BVar1._data;
  SVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return SVar2;
}

Assistant:

StringView String::findOr(const StringView substring, const char* const fail) const {
    return StringView{*this}.findOr(substring, fail);
}